

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::setupFixed
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool param_9)

{
  btMultibodyLink *pbVar1;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  btScalar in_XMM0_Da;
  btMultiBody *in_stack_00000008;
  btScalar *in_stack_000001a8;
  btMultibodyLink *in_stack_000001b0;
  
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  pbVar1->m_mass = in_XMM0_Da;
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  *(undefined8 *)(pbVar1->m_inertiaLocal).m_floats = *in_RDX;
  *(undefined8 *)((pbVar1->m_inertiaLocal).m_floats + 2) = in_RDX[1];
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  pbVar1->m_parent = in_ECX;
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  *(undefined8 *)(pbVar1->m_zeroRotParentToThis).super_btQuadWord.m_floats = *in_R8;
  *(undefined8 *)((pbVar1->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2) = in_R8[1];
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  *(_func_int ***)(pbVar1->m_dVector).m_floats = in_stack_00000008->_vptr_btMultiBody;
  *(btMultiBodyLinkCollider **)((pbVar1->m_dVector).m_floats + 2) =
       in_stack_00000008->m_baseCollider;
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  *(undefined8 *)(pbVar1->m_eVector).m_floats = *in_R9;
  *(undefined8 *)((pbVar1->m_eVector).m_floats + 2) = in_R9[1];
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  pbVar1->m_jointType = eFixed;
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  pbVar1->m_dofCount = 0;
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  pbVar1->m_posVarCount = 0;
  pbVar1 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  pbVar1->m_flags = pbVar1->m_flags | 1;
  btAlignedObjectArray<btMultibodyLink>::operator[]
            ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),in_ESI);
  btMultibodyLink::updateCacheMultiDof(in_stack_000001b0,in_stack_000001a8);
  updateLinksDofOffsets(in_stack_00000008);
  return;
}

Assistant:

void btMultiBody::setupFixed(int i,
						   btScalar mass,
						   const btVector3 &inertia,
						   int parent,
						   const btQuaternion &rotParentToThis,
						   const btVector3 &parentComToThisPivotOffset,
                           const btVector3 &thisPivotToThisComOffset, bool /*deprecatedDisableParentCollision*/)
{
	
	m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;
	m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;    

	m_links[i].m_jointType = btMultibodyLink::eFixed;
	m_links[i].m_dofCount = 0;
	m_links[i].m_posVarCount = 0;

	m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;    
	
	m_links[i].updateCacheMultiDof();

	updateLinksDofOffsets();

}